

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_tri(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  ulong global;
  long lVar11;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT face_id;
  REF_INT new_tri;
  REF_INT new_node;
  REF_INT nodes [4];
  REF_DBL xyz [3];
  int local_7c;
  int local_78;
  REF_INT local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  REF_GRID_conflict local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x6f
             ,"ref_import_tri","unable to open file");
      uVar4 = 2;
    }
    else {
      iVar5 = __isoc99_fscanf(__stream,"%d %d",&local_78,&local_7c);
      if (iVar5 == 2) {
        local_50 = pRVar1;
        if (0 < local_78) {
          global = 0;
          do {
            uVar4 = ref_node_add(ref_node,global,(REF_INT *)&local_6c);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x74,"ref_import_tri",(ulong)uVar4,"new_node");
              return uVar4;
            }
            if (global != local_6c) {
              pcVar10 = "node index";
              uVar8 = 0x75;
              goto LAB_001562f7;
            }
            global = global + 1;
          } while ((long)global < (long)local_78);
        }
        uVar4 = ref_node_initialize_n_global(ref_node,(long)local_78);
        if (uVar4 == 0) {
          if (0 < local_78) {
            lVar11 = 0;
            lVar9 = 0;
            do {
              iVar5 = __isoc99_fscanf(__stream,"%lf %lf %lf",&local_48,local_40,local_38);
              if (iVar5 != 3) {
                pcVar10 = "xyz";
                uVar8 = 0x7b;
                goto LAB_001562f7;
              }
              pRVar2 = ref_node->real;
              lVar7 = 0;
              do {
                *(undefined8 *)((long)pRVar2 + lVar7 * 8 + lVar11) =
                     *(undefined8 *)(local_40 + lVar7 * 8 + -8);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              lVar9 = lVar9 + 1;
              lVar11 = lVar11 + 0x78;
            } while (lVar9 < local_78);
          }
          pRVar3 = local_50->cell[3];
          local_5c = 0xffffffff;
          if (0 < local_7c) {
            iVar5 = 0;
            do {
              lVar9 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_68 + lVar9);
                if (iVar6 != 1) {
                  pcVar10 = "tri";
                  uVar8 = 0x84;
                  goto LAB_001562f7;
                }
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              local_68 = local_68 + -1;
              local_64 = local_64 + -1;
              local_60 = local_60 + -1;
              uVar4 = ref_cell_add(pRVar3,&local_68,&local_70);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x88,"ref_import_tri",(ulong)uVar4,"new tri");
                return uVar4;
              }
              if (iVar5 != local_70) {
                pcVar10 = "tri index";
                uVar8 = 0x89;
                goto LAB_001562f7;
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < local_7c);
          }
          if (0 < local_7c) {
            pRVar3 = local_50->cell[3];
            iVar5 = 0;
            do {
              iVar6 = __isoc99_fscanf(__stream,"%d",&local_74);
              if (iVar6 != 1) {
                pcVar10 = "tri id";
                uVar8 = 0x8e;
                goto LAB_001562f7;
              }
              pRVar3->c2n[(long)pRVar3->size_per * (long)iVar5 + 3] = local_74;
              iVar5 = iVar5 + 1;
            } while (iVar5 < local_7c);
          }
          fclose(__stream);
          uVar4 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x78,"ref_import_tri",(ulong)uVar4,"init glob");
        }
      }
      else {
        pcVar10 = "nnode ntri";
        uVar8 = 0x71;
LAB_001562f7:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar8,"ref_import_tri",pcVar10);
        uVar4 = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x69,
           "ref_import_tri",(ulong)uVar4,"create grid");
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_import_tri(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri;
  REF_INT ixyz, node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[4];
  REF_INT face_id;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(2, fscanf(file, "%d %d", &nnode, &ntri), "nnode ntri");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  for (node = 0; node < nnode; node++) {
    RES(3, fscanf(file, "%lf %lf %lf", &(xyz[0]), &(xyz[1]), &(xyz[2])), "xyz");
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) = xyz[ixyz];
  }

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  fclose(file);

  return REF_SUCCESS;
}